

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>>
::
init_coboundary_and_get_pivot<Gudhi::ripser::Heap<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t,std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t>>,Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t>>>
          (optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,
          Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>>
          *this,diameter_entry_t simplex,
          Heap<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>_>,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>_>
          *working_coboundary,dimension_t dim,entry_hash_map *pivot_column_index)

{
  iterator __position;
  ulong *puVar1;
  byte bVar2;
  optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
  *poVar3;
  node_pointer ppVar4;
  ulong *puVar5;
  diameter_entry_t simplex_00;
  optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
  cofacet;
  undefined1 local_78 [16];
  bool local_68;
  optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
  *local_60;
  Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>>
  *local_58;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t,_unsigned_long>_>,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t,_unsigned_long,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::Entry_hash,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::Equal_index>_>
  *local_50;
  optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
  local_48;
  
  if (*(long *)(this + 0x98) != *(long *)(this + 0x90)) {
    *(long *)(this + 0x98) = *(long *)(this + 0x90);
  }
  local_58 = this + 0x90;
  local_60 = __return_storage_ptr__;
  local_50 = &pivot_column_index->table_;
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
  ::
  Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
  ::set_simplex((Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
                 *)(this + 0x158),
                (diameter_entry_t)
                simplex.
                super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
                ,dim);
  bVar2 = 1;
  while( true ) {
    do {
      do {
        Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
        ::
        Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
        ::next_raw((optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
                    *)local_78,
                   (Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
                    *)(this + 0x158),true);
        if (local_68 != true) {
          puVar5 = *(ulong **)(this + 0x90);
          puVar1 = *(ulong **)(this + 0x98);
          if (puVar5 != puVar1) {
            do {
              local_78._0_8_ = *puVar5;
              local_78._8_8_ = puVar5[1];
              std::
              priority_queue<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>_>,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>_>
              ::push(&working_coboundary->
                      super_priority_queue<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>_>,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>_>
                     ,(value_type *)local_78);
              puVar5 = puVar5 + 2;
            } while (puVar5 != puVar1);
          }
          poVar3 = local_60;
          get_pivot<Gudhi::ripser::Heap<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t,std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t>>,Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t>>>
                    (local_60,this,working_coboundary);
          return poVar3;
        }
      } while (*(float *)(*(long *)(this + 0x1a8) + 0x38) < (float)local_78._0_4_);
      __position._M_current = *(diameter_entry_t **)(this + 0x98);
      if (__position._M_current == *(diameter_entry_t **)(this + 0xa0)) {
        std::
        vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t>>
        ::
        _M_realloc_insert<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t_const&>
                  ((vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t>>
                    *)local_58,__position,(diameter_entry_t *)local_78);
      }
      else {
        *(undefined8 *)
         &(__position._M_current)->
          super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
             = local_78._0_8_;
        ((__position._M_current)->
        super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
        ).second.content = local_78._8_8_;
        *(long *)(this + 0x98) = *(long *)(this + 0x98) + 0x10;
      }
    } while (!(bool)((float)local_78._0_4_ ==
                     simplex.
                     super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
                     .first & bVar2));
    ppVar4 = boost::unordered::detail::
             table<boost::unordered::detail::map<std::allocator<std::pair<const_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t,_unsigned_long>_>,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t,_unsigned_long,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::Entry_hash,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::Equal_index>_>
             ::find_node(local_50,(const_key_type *)(local_78 + 8));
    if ((ppVar4 == (node_pointer)0x0) &&
       (simplex_00.
        super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
        .second.content = local_78._8_8_,
       simplex_00.
       super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
       ._0_8_ = local_78._0_8_ & 0xffffffff,
       Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>_>
       ::get_zero_apparent_facet
                 (&local_48,
                  (Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>_>
                   *)this,simplex_00,dim + '\x01'),
       local_48.
       super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
       ._M_payload.
       super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
       ._M_engaged == false)) break;
    bVar2 = 0;
  }
  *(undefined8 *)
   &(local_60->
    super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
    )._M_payload.
    super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
    ._M_payload = local_78._0_8_;
  ((entry_with_coeff_t *)
  ((long)&(local_60->
          super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
          )._M_payload.
          super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
          ._M_payload + 8))->content = local_78._8_8_;
  (local_60->
  super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
  )._M_payload.
  super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
  ._M_engaged = true;
  return local_60;
}

Assistant:

std::optional<diameter_entry_t> init_coboundary_and_get_pivot(const diameter_entry_t simplex,
        Column& working_coboundary, const dimension_t dim,
        entry_hash_map& pivot_column_index) {
      bool check_for_emergent_pair = true;
      cofacet_entries.clear();
      cofacets2.set_simplex(simplex, dim);
      while(true) {
        std::optional<diameter_entry_t> cofacet = cofacets2.next();
        if (!cofacet) break;
        cofacet_entries.push_back(*cofacet);
        if (check_for_emergent_pair && (get_diameter(simplex) == get_diameter(*cofacet))) {
          if ((pivot_column_index.find(get_entry(*cofacet)) == pivot_column_index.end()) &&
              !get_zero_apparent_facet(*cofacet, dim + 1))
            return *cofacet;
          check_for_emergent_pair = false;
        }
      }
      for (auto cofacet : cofacet_entries) working_coboundary.push(cofacet);
      return get_pivot(working_coboundary);
    }